

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionContext::SignWithKey
          (ConfidentialTransactionContext *this,OutPoint *outpoint,Pubkey *pubkey,Privkey *privkey,
          SigHashType *sighash_type,bool has_grind_r)

{
  bool bVar1;
  undefined8 uVar2;
  UtxoData *in_RDI;
  SigHashType *in_R8;
  byte in_R9B;
  uint uVar3;
  UtxoData utxo;
  undefined4 in_stack_fffffffffffffa24;
  string *in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffa40;
  UtxoData *utxo_00;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  ConfidentialTransactionContext *in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffaa7;
  undefined6 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaae;
  allocator in_stack_fffffffffffffaaf;
  SigHashType *in_stack_fffffffffffffab0;
  Privkey *in_stack_fffffffffffffab8;
  Pubkey *in_stack_fffffffffffffac0;
  OutPoint *in_stack_fffffffffffffac8;
  ConfidentialTransactionContext *in_stack_fffffffffffffad0;
  AddressType in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffb47;
  ConfidentialValue *in_stack_fffffffffffffb48;
  pointer in_stack_fffffffffffffb50;
  pointer in_stack_fffffffffffffb58;
  pointer in_stack_fffffffffffffb60;
  OutPoint *in_stack_fffffffffffffb68;
  ConfidentialTransactionContext *in_stack_fffffffffffffb70;
  AddressType in_stack_fffffffffffffb80;
  BlindFactor local_b0;
  ConfidentialValue local_90 [2];
  byte local_29;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffa38 >> 0x20);
  local_29 = in_R9B & 1;
  utxo_00 = (UtxoData *)&stack0xfffffffffffffae0;
  UtxoData::UtxoData(in_RDI);
  bVar1 = IsFindUtxoMap(in_stack_fffffffffffffa98,
                        (OutPoint *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                        utxo_00);
  if (bVar1) {
    bVar1 = core::BlindFactor::IsEmpty(&local_b0);
    if ((!bVar1) || (bVar1 = core::ConfidentialValue::HasBlinding(local_90), bVar1)) {
      core::SigHashType::SigHashType((SigHashType *)&stack0xfffffffffffffa94,in_R8);
      uVar3 = local_29 & 1;
      SignWithPrivkeySimple
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                 (Pubkey *)in_stack_fffffffffffffb60,(Privkey *)in_stack_fffffffffffffb58,
                 (SigHashType *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                 in_stack_fffffffffffffb80,(bool)in_stack_fffffffffffffb47);
    }
    else {
      core::SigHashType::SigHashType((SigHashType *)&stack0xfffffffffffffaa0,in_R8);
      uVar3 = local_29 & 1;
      SignWithPrivkeySimple
                (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                 (Amount *)
                 CONCAT17(in_stack_fffffffffffffaaf,
                          CONCAT16(in_stack_fffffffffffffaae,in_stack_fffffffffffffaa8)),
                 in_stack_fffffffffffffae0,(bool)in_stack_fffffffffffffaa7);
    }
    UtxoData::~UtxoData((UtxoData *)CONCAT44(in_stack_fffffffffffffa24,uVar3));
    return;
  }
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffab0,"Utxo is not found. sign fail.",
             (allocator *)&stack0xfffffffffffffaaf);
  core::CfdException::CfdException(in_stack_fffffffffffffa40,error_code,in_stack_fffffffffffffa30);
  __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void ConfidentialTransactionContext::SignWithKey(
    const OutPoint& outpoint, const Pubkey& pubkey, const Privkey& privkey,
    SigHashType sighash_type, bool has_grind_r) {
  UtxoData utxo;
  if (!IsFindUtxoMap(outpoint, &utxo)) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Utxo is not found. sign fail.");
  }

  if (utxo.amount_blind_factor.IsEmpty() &&
      (!utxo.value_commitment.HasBlinding())) {
    SignWithPrivkeySimple(
        outpoint, pubkey, privkey, sighash_type, utxo.amount,
        utxo.address_type, has_grind_r);
  } else {
    SignWithPrivkeySimple(
        outpoint, pubkey, privkey, sighash_type, utxo.value_commitment,
        utxo.address_type, has_grind_r);
  }
}